

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poll.cpp
# Opt level: O2

void __thiscall Poll::unsubscribe(Poll *this,Subscriber *sub)

{
  pointer ppVar1;
  pollfd *i;
  iterator __it;
  pointer ppVar2;
  vector<pollfd,_std::allocator<pollfd>_> *__range1;
  int fd;
  int local_14;
  
  local_14 = Subscriber::get_fd(sub);
  __it = std::
         _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Subscriber>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Subscriber>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
         ::find(&(this->subs)._M_h,&local_14);
  if (__it.super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false>.
      _M_cur != (__node_type *)0x0) {
    std::
    _Hashtable<int,_std::pair<const_int,_std::shared_ptr<Subscriber>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<Subscriber>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::erase(&(this->subs)._M_h,
            (const_iterator)
            __it.
            super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<Subscriber>_>,_false>.
            _M_cur);
    ppVar1 = (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (ppVar2 = (this->fds).super__Vector_base<pollfd,_std::allocator<pollfd>_>._M_impl.
                  super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
      if (ppVar2->fd == local_14) {
        ppVar2->fd = -0x80000000;
      }
    }
  }
  return;
}

Assistant:

void Poll::unsubscribe(Subscriber &sub) {
  int fd = sub.get_fd();
  auto it = subs.find(fd);
  if (it == this->subs.end()) {
    return;
  }
  this->subs.erase(it);
  for (auto &i: this->fds) { //TODO remove not needed fds
    if (i.fd == fd) {
      i.fd = DELETED;
      if (i.fd == 0) i.fd = -1;
    }
  }
}